

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::FileDescriptorProto::InternalSerializeWithCachedSizesToArray
          (FileDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int iVar2;
  int32 iVar3;
  string *s;
  size_t __n;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  ServiceDescriptorProto *this_02;
  FieldDescriptorProto *this_03;
  FileOptions *this_04;
  SourceCodeInfo *this_05;
  void *pvVar4;
  uint8 *puVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint8 *local_40;
  uint local_34;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  local_40 = target;
  if ((uVar1 & 1) != 0) {
    local_40 = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  local_34 = uVar1;
  if ((uVar1 & 2) != 0) {
    local_40 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,2,(this->package_).ptr_,local_40);
  }
  uVar1 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  uVar8 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar8;
  }
  for (; puVar5 = local_40, uVar6 != uVar8; uVar8 = uVar8 + 1) {
    s = (string *)((this->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[uVar8];
    __n = s->_M_string_length;
    if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)local_40)))) {
      *local_40 = '\x1a';
      local_40[1] = (uint8)__n;
      memcpy(local_40 + 2,(s->_M_dataplus)._M_p,__n);
      local_40 = puVar5 + __n + 2;
    }
    else {
      local_40 = io::EpsCopyOutputStream::WriteStringOutline(stream,3,s,local_40);
    }
  }
  iVar2 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar2 != iVar7; iVar7 = iVar7 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_00 = (DescriptorProto *)
              ((this->message_type_).super_RepeatedPtrFieldBase.rep_)->elements[iVar7];
    *local_40 = '\"';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = DescriptorProto::InternalSerializeWithCachedSizesToArray(this_00,puVar5,stream);
  }
  iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar2 != iVar7; iVar7 = iVar7 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_01 = (EnumDescriptorProto *)
              ((this->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[iVar7];
    *local_40 = '*';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_01->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = EnumDescriptorProto::InternalSerializeWithCachedSizesToArray(this_01,puVar5,stream);
  }
  iVar2 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar2 != iVar7; iVar7 = iVar7 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_02 = (ServiceDescriptorProto *)
              ((this->service_).super_RepeatedPtrFieldBase.rep_)->elements[iVar7];
    *local_40 = '2';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_02->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = ServiceDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_02,puVar5,stream);
  }
  iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; uVar1 = local_34, iVar2 != iVar7; iVar7 = iVar7 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_03 = (FieldDescriptorProto *)
              ((this->extension_).super_RepeatedPtrFieldBase.rep_)->elements[iVar7];
    *local_40 = ':';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_03->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = FieldDescriptorProto::InternalSerializeWithCachedSizesToArray(this_03,puVar5,stream);
  }
  if ((local_34 & 8) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_04 = this->options_;
    *local_40 = 'B';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_04->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = FileOptions::InternalSerializeWithCachedSizesToArray(this_04,puVar5,stream);
  }
  if ((uVar1 & 0x10) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_05 = this->source_code_info_;
    *local_40 = 'J';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_05->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = SourceCodeInfo::InternalSerializeWithCachedSizesToArray(this_05,puVar5,stream);
  }
  uVar1 = (this->public_dependency_).current_size_;
  uVar6 = 0;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    iVar3 = *(int32 *)((long)(this->public_dependency_).arena_or_elements_ + uVar6 * 4);
    *local_40 = 'P';
    local_40 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar3,local_40 + 1);
  }
  uVar1 = (this->weak_dependency_).current_size_;
  uVar8 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar8;
  }
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    iVar3 = *(int32 *)((long)(this->weak_dependency_).arena_or_elements_ + uVar8 * 4);
    *local_40 = 'X';
    local_40 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar3,local_40 + 1);
  }
  if ((local_34 & 4) != 0) {
    local_40 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,0xc,(this->syntax_).ptr_,local_40);
  }
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    local_40 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),local_40,stream);
  }
  return local_40;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* FileDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_package().data(), static_cast<int>(this->_internal_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->_internal_dependency_size(); i < n; i++) {
    const auto& s = this->_internal_dependency(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    target = stream->WriteString(3, s, target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_message_type_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(4, this->_internal_message_type(i), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_enum_type_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(5, this->_internal_enum_type(i), target, stream);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_service_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(6, this->_internal_service(i), target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(7, this->_internal_extension(i), target, stream);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        8, _Internal::options(this), target, stream);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        9, _Internal::source_code_info(this), target, stream);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0, n = this->_internal_public_dependency_size(); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(10, this->_internal_public_dependency(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0, n = this->_internal_weak_dependency_size(); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(11, this->_internal_weak_dependency(i), target);
  }

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_syntax().data(), static_cast<int>(this->_internal_syntax().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    target = stream->WriteStringMaybeAliased(
        12, this->_internal_syntax(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}